

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_m44d(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  long in_RSI;
  exr_attr_m44d_t tmp;
  exr_result_t rv;
  void *in_stack_ffffffffffffff68;
  _internal_exr_context *in_stack_ffffffffffffff70;
  _internal_exr_context *in_stack_ffffffffffffff78;
  exr_result_t local_14;
  
  memcpy(&stack0xffffffffffffff6c,*(void **)(in_RSI + 0x18),0x80);
  local_14 = save_attr_sz(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
  if (local_14 == 0) {
    local_14 = save_attr_64(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
  }
  return local_14;
}

Assistant:

static exr_result_t
save_m44d (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m44d_t tmp = *(a->m44d);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m44d_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_64 (ctxt, &tmp, 16);
    return rv;
}